

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_chord_height(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_ADJ_ITEM pRVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_INT nodes [27];
  long local_100;
  double local_e8 [4];
  double local_c8 [3];
  int iStack_ac;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  if (-1 < node1) {
    ref_cell = ref_grid->cell[0];
    pRVar3 = ref_cell->ref_adj;
    if ((node1 < pRVar3->nnode) && (local_100 = (long)pRVar3->first[(uint)node1], local_100 != -1))
    {
      uVar7 = ref_cell_nodes(ref_cell,pRVar3->item[local_100].ref,local_a8);
      if (uVar7 == 0) {
        do {
          lVar8 = (long)ref_cell->node_per;
          if (0 < lVar8) {
            lVar9 = 0;
            bVar6 = false;
            do {
              if (local_a8[lVar9] == node0) {
                bVar6 = true;
              }
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
            if ((!bVar6) && (0 < ref_cell->node_per)) {
              lVar9 = 0;
              do {
                if (local_a8[lVar9] == node1) {
                  pRVar4 = pRVar2->real;
                  iVar1 = local_a8[1 - lVar9];
                  lVar10 = 0;
                  do {
                    dVar11 = pRVar4[node0 * 0xf + lVar10];
                    local_c8[lVar10] = pRVar4[(ulong)(uint)(node1 * 0xf) + lVar10] - dVar11;
                    local_e8[lVar10] = pRVar4[(long)iVar1 * 0xf + lVar10] - dVar11;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  dVar14 = SQRT(local_e8[2] * local_e8[2] +
                                local_e8[0] * local_e8[0] + local_e8[1] * local_e8[1]);
                  dVar16 = local_c8[1] * local_e8[2] - local_e8[1] * local_c8[2];
                  dVar15 = local_c8[2] * local_e8[0] - local_e8[2] * local_c8[0];
                  dVar11 = local_c8[0] * local_e8[1] - local_e8[0] * local_c8[1];
                  dVar11 = SQRT(dVar11 * dVar11 + dVar16 * dVar16 + dVar15 * dVar15);
                  auVar12._0_8_ = dVar14 * 1e+20;
                  auVar12._8_8_ = dVar11;
                  auVar13._8_8_ = -dVar11;
                  auVar13._0_8_ = -auVar12._0_8_;
                  auVar13 = maxpd(auVar12,auVar13);
                  if (auVar13._0_8_ <= auVar13._8_8_) {
                    return 0;
                  }
                  dVar11 = dVar11 / dVar14;
                  if (0.1 < dVar11 / dVar14) {
                    return 0;
                  }
                  if (dVar11 <= -dVar11) {
                    dVar11 = -dVar11;
                  }
                  if (auVar13._0_8_ <= dVar11) {
                    return 0;
                  }
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != lVar8);
            }
          }
          pRVar5 = ref_cell->ref_adj->item;
          local_100 = (long)pRVar5[(int)local_100].next;
          if (local_100 == -1) goto LAB_001c6431;
          uVar7 = ref_cell_nodes(ref_cell,pRVar5[local_100].ref,local_a8);
        } while (uVar7 == 0);
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x25a,"ref_collapse_edge_chord_height",(ulong)uVar7,"nodes");
      return uVar7;
    }
  }
LAB_001c6431:
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_chord_height(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_INT i;
  REF_DBL n0[3], n1[3], cross_prod[3];
  REF_DBL new_length, cross_length, chord, chord_ratio;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        /* triangle node0, node1, nodes[node] */
        /* nodes[node] = node0; */
        for (i = 0; i < 3; i++) {
          n0[i] = ref_node_xyz(ref_node, i, node1) -
                  ref_node_xyz(ref_node, i, node0);
          n1[i] = ref_node_xyz(ref_node, i, nodes[1 - node]) -
                  ref_node_xyz(ref_node, i, node0);
        }
        new_length = sqrt(ref_math_dot(n1, n1));
        ref_math_cross_product(n0, n1, cross_prod);
        cross_length = sqrt(ref_math_dot(cross_prod, cross_prod));
        /* |n0 x n1| = |n0||n1|sin(t) */
        if (ref_math_divisible(cross_length, new_length)) {
          chord = cross_length / new_length;
          if (ref_math_divisible(chord, new_length)) {
            chord_ratio = chord / new_length;
            if (chord_ratio > 0.1) return REF_SUCCESS;
          } else {
            return REF_SUCCESS;
          }
        } else {
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}